

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O2

void ctype_prepqual(CTRepr *ctr,CTInfo info)

{
  if ((info >> 0x18 & 1) != 0) {
    ctype_prepstr(ctr,"volatile",8);
  }
  if ((info >> 0x19 & 1) == 0) {
    return;
  }
  ctype_prepstr(ctr,"const",5);
  return;
}

Assistant:

static void ctype_prepqual(CTRepr *ctr, CTInfo info)
{
  if ((info & CTF_VOLATILE)) ctype_preplit(ctr, "volatile");
  if ((info & CTF_CONST)) ctype_preplit(ctr, "const");
}